

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

tnt_error tnt_io_connect(tnt_stream_net *s)

{
  socklen_t __len;
  uri *puVar1;
  sockaddr *__addr;
  addrinfo *paVar2;
  size_t __n;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int iVar5;
  tnt_error tVar6;
  int iVar7;
  int *piVar8;
  char *__service;
  char cVar9;
  bool bVar10;
  char local_158 [8];
  char host [128];
  timeval start_connect;
  int local_68;
  int local_58;
  addrinfo *addr_info;
  addrinfo *local_48;
  pollfd local_40;
  pollfd fds [1];
  
  puVar1 = (s->opt).uri;
  if ((uint)puVar1->host_hint < 3) {
    __service = "3301";
    if (puVar1->service != (char *)0x0) {
      __service = puVar1->service;
    }
    memcpy(local_158,puVar1->host,puVar1->host_len);
    local_158[puVar1->host_len] = '\0';
    _local_58 = (addrinfo *)0x0;
    host[0x78] = '\0';
    host[0x79] = '\0';
    host[0x7a] = '\0';
    host[0x7b] = '\0';
    host[0x7c] = '\0';
    host[0x7d] = '\0';
    host[0x7e] = '\0';
    host[0x7f] = '\0';
    iVar5 = getaddrinfo(local_158,__service,(addrinfo *)(host + 0x78),
                        (addrinfo **)&stack0xffffffffffffffa8);
    local_48 = _local_58;
    if (iVar5 != 0) {
      local_48 = (addrinfo *)0x0;
    }
    tVar6 = TNT_ERESOLVE;
    if (iVar5 == 0 && _local_58 != (addrinfo *)0x0) {
      tVar6 = TNT_EOK;
      for (paVar2 = local_48; paVar2 != (addrinfo *)0x0; paVar2 = paVar2->ai_next) {
        iVar5 = socket(paVar2->ai_family,paVar2->ai_socktype,paVar2->ai_protocol);
        s->fd = iVar5;
        if (iVar5 < 0) {
          piVar8 = __errno_location();
          s->errno_ = *piVar8;
          tVar6 = TNT_ESYSTEM;
        }
        else {
          tVar6 = tnt_io_setopts(s);
          if (tVar6 == TNT_EOK) {
            __addr = paVar2->ai_addr;
            __len = paVar2->ai_addrlen;
            tVar6 = tnt_io_nonblock(s,1);
            if (tVar6 == TNT_EOK) {
              iVar5 = connect(s->fd,__addr,__len);
              tVar6 = TNT_EOK;
              if (iVar5 == -1) {
                fds[0] = (pollfd)__errno_location();
                if (*(int *)fds[0] == 0x73) {
                  iVar5 = gettimeofday((timeval *)(host + 0x78),(__timezone_ptr_t)0x0);
                  uVar4 = host._120_8_;
                  if (iVar5 == -1) {
                    s->errno_ = *(int *)fds[0];
                    tVar6 = TNT_ESYSTEM;
                    bVar10 = false;
                  }
                  else {
                    auVar3 = SEXT816(0x20c49ba5e353f7cf) * SEXT816((s->opt).tmout_connect.tv_usec);
                    iVar5 = ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) +
                            (int)(s->opt).tmout_connect.tv_sec * 1000;
                    do {
                      local_40.fd = s->fd;
                      local_40.events = 4;
                      iVar7 = poll(&local_40,1,iVar5);
                      cVar9 = '\x01';
                      if (iVar7 == 0) {
                        tVar6 = TNT_ETMOUT;
                      }
                      else if (iVar7 == -1) {
                        iVar7 = *(int *)fds[0];
                        if ((iVar7 == 0xb) || (iVar7 == 4)) {
                          iVar7 = gettimeofday((timeval *)&stack0xffffffffffffffa8,
                                               (__timezone_ptr_t)0x0);
                          if (iVar7 != -1) {
                            local_68 = (int)uVar4;
                            auVar3 = SEXT816((long)((long)&addr_info[-0x20000001].ai_next + 7)) *
                                     SEXT816(0x20c49ba5e353f7cf);
                            iVar7 = ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) +
                                    (local_58 - local_68) * 1000;
                            cVar9 = iVar5 <= iVar7;
                            if (iVar5 <= iVar7) {
                              tVar6 = TNT_ETMOUT;
                            }
                            goto LAB_0010d321;
                          }
                          iVar7 = *(int *)fds[0];
                        }
                        s->errno_ = iVar7;
                        tVar6 = TNT_ESYSTEM;
                      }
                      else {
                        cVar9 = '\x03';
                      }
LAB_0010d321:
                    } while (cVar9 == '\0');
                    if (cVar9 == '\x03') {
                      _local_58 = (addrinfo *)((ulong)_local_58 & 0xffffffff00000000);
                      local_40.fd = 4;
                      iVar5 = getsockopt(s->fd,1,4,&stack0xffffffffffffffa8,(socklen_t *)&local_40);
                      cVar9 = '\0';
                      if (local_58 != 0 || iVar5 == -1) {
                        iVar5 = local_58;
                        if (local_58 == 0) {
                          iVar5 = *(int *)fds[0];
                        }
                        s->errno_ = iVar5;
                        tVar6 = TNT_ESYSTEM;
                        cVar9 = '\x01';
                      }
                    }
                    bVar10 = cVar9 == '\0';
                  }
                  if (bVar10) {
                    tVar6 = tnt_io_nonblock(s,0);
                  }
                }
                else {
                  s->errno_ = *(int *)fds[0];
                  tVar6 = TNT_ESYSTEM;
                }
              }
            }
            if (tVar6 == TNT_EOK) {
              tVar6 = TNT_EOK;
              break;
            }
          }
          if (0 < s->fd) {
            close(s->fd);
            s->fd = -1;
          }
          s->connected = 0;
        }
      }
    }
    if (local_48 != (addrinfo *)0x0) {
      freeaddrinfo(local_48);
    }
  }
  else {
    tVar6 = TNT_EFAIL;
    if (puVar1->host_hint == 3) {
      __n = puVar1->service_len;
      memcpy(local_158,puVar1->service,__n);
      local_158[__n] = '\0';
      iVar5 = socket(1,1,0);
      s->fd = iVar5;
      if (iVar5 < 0) {
        piVar8 = __errno_location();
        s->errno_ = *piVar8;
      }
      else {
        tVar6 = tnt_io_setopts(s);
        if (tVar6 != TNT_EOK) {
          if (0 < s->fd) {
            close(s->fd);
            s->fd = -1;
          }
          s->connected = 0;
          goto LAB_0010d4e6;
        }
        host[0x78] = '\x01';
        host[0x79] = '\0';
        host[0x7a] = '\0';
        host[0x7b] = '\0';
        host[0x7c] = '\0';
        host[0x7d] = '\0';
        host[0x7e] = '\0';
        host[0x7f] = '\0';
        strcpy(host + 0x7a,local_158);
        iVar5 = connect(s->fd,(sockaddr *)(host + 0x78),0x6e);
        tVar6 = TNT_EOK;
        if (iVar5 != -1) goto LAB_0010d4e6;
        piVar8 = __errno_location();
        s->errno_ = *piVar8;
        if (0 < s->fd) {
          close(s->fd);
          s->fd = -1;
        }
        s->connected = 0;
      }
      tVar6 = TNT_ESYSTEM;
    }
  }
LAB_0010d4e6:
  if (tVar6 == TNT_EOK) {
    s->connected = 1;
    tVar6 = TNT_EOK;
  }
  return tVar6;
}

Assistant:

enum tnt_error
tnt_io_connect(struct tnt_stream_net *s)
{
	enum tnt_error result;
	struct uri *uri = s->opt.uri;
	switch (uri->host_hint) {
	case URI_NAME:
	case URI_IPV4:
	case URI_IPV6: {
		char host[128];
		const char *port = uri->service == NULL ? "3301" :
			uri->service;
		memcpy(host, uri->host, uri->host_len);
		host[uri->host_len] = '\0';
		result = tnt_io_connect_tcp(s, host, port);
		break;
	}
	case URI_UNIX: {
		char service[128];
		memcpy(service, uri->service, uri->service_len);
		service[uri->service_len] = '\0';
		result = tnt_io_connect_unix(s, service);
		break;
	}
	default:
		result = TNT_EFAIL;
	}
	if (result != TNT_EOK)
		return result;
	s->connected = 1;
	return TNT_EOK;
}